

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O1

_Bool borg_load_formulas(ang_file *fp)

{
  int iVar1;
  _Bool _Var2;
  undefined1 uVar3;
  char *s;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  _Bool _Var7;
  char buf [1024];
  int local_448;
  char local_438 [1032];
  
  borg_formulas.restock.count = 0;
  borg_formulas.depth.count = 0;
  borg_formulas.power.count = 0;
  iVar1 = borg_cfg[0xd];
  _Var7 = iVar1 == 0;
  _Var2 = file_getl(fp,local_438,0x3ff);
  if (_Var2) {
    _Var7 = iVar1 == 0;
    local_448 = 0;
    do {
      s = borg_trim(local_438);
      if ((*s == '\0') || (*s == '#')) {
LAB_002236f7:
        lVar5 = 2;
LAB_002236fd:
        uVar3 = (*(code *)((long)&DAT_00286328 + (long)(int)(&DAT_00286328)[lVar5]))();
        return (_Bool)uVar3;
      }
      _Var2 = prefix_i(s,"[END FORMULA SECTION]");
      lVar5 = 3;
      if (_Var2) goto LAB_002236fd;
      if (_Var7) goto LAB_002236f7;
      if (*s == ']') {
        bVar6 = local_448 == 0;
        local_448 = 0;
        switch(bVar6) {
        case true:
          return false;
        }
      }
      else {
        if (*s == '[') {
          uVar3 = (*(code *)0x223709)();
          return (_Bool)uVar3;
        }
        _Var2 = prefix_i(s,"Power");
        if (_Var2) {
          uVar3 = (*(code *)0x223709)();
          return (_Bool)uVar3;
        }
        _Var2 = prefix_i(s,"Depth Requirement");
        if (_Var2) {
          if (local_448 != 0) {
            _Var7 = true;
          }
          local_448 = 2;
        }
        else {
          _Var2 = prefix_i(s,"Restock Requirement");
          if (_Var2) {
            uVar3 = (*(code *)0x223709)();
            return (_Bool)uVar3;
          }
          sVar4 = strlen(s);
          if (s[sVar4 - 1] == ';') {
            if (local_448 == 2) {
              parse_depth_line(false,s,local_438);
            }
            if (local_448 == 3) {
              parse_depth_line(true,s,local_438);
            }
            if (local_448 == 1) {
              parse_power_line(s,local_438);
            }
            lVar5 = 0;
            if (local_448 == 0) {
              borg_formula_error(local_438,local_438,"base",
                                 "** line must be part of a Power or Depth section");
            }
            goto LAB_002236fd;
          }
          if (local_448 == 1) {
            borg_formula_error(local_438,local_438,"power","** line must end in a ;");
            _Var7 = true;
          }
          else if (local_448 == 3) {
            borg_formula_error(local_438,local_438,"restock","** line must end in a ;");
            _Var7 = true;
          }
          else if (local_448 == 2) {
            borg_formula_error(local_438,local_438,"depth","** line must end in a ;");
            _Var7 = true;
          }
          else {
            borg_formula_error(local_438,local_438,"base","** line must end in a ;");
            _Var7 = true;
          }
        }
      }
      _Var2 = file_getl(fp,local_438,0x3ff);
    } while (_Var2);
  }
  if ((_Var7 != false) && (_Var7 = true, borg_cfg[0xd] != 0)) {
    borg_cfg[0xd] = 0;
  }
  return _Var7;
}

Assistant:

bool borg_load_formulas(ang_file *fp)
{
    enum e_section { SEC_NONE, SEC_POWER, SEC_DEPTH, SEC_RESTOCK };

    char           buf[1024];
    bool           formulas_off = false;
    enum e_section section      = SEC_NONE;
    bool           skip_open    = true;

    borg_formulas.restock.count = 0;
    borg_formulas.depth.count   = 0;
    borg_formulas.power.count   = 0;

    /* read but don't process formulas if we aren't using them */
    if (!borg_cfg[BORG_USES_DYNAMIC_CALCS])
        formulas_off = true;

    /* Parse the formula section of the file */
    while (file_getl(fp, buf, sizeof(buf) - 1)) {

        char *line = borg_trim(buf);

        /* Skip comments and blank lines */
        if (!line[0] || (line[0] == '#'))
            continue;

        if (prefix_i(line, "[END FORMULA SECTION]"))
            break;

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        /* sections are bounded in [] */
        if (line[0] == '[') {
            if (!skip_open)
                formulas_off = true;

            skip_open = false;
            continue;
        }
        if (line[0] == ']') {
            if (section == SEC_NONE)
                return formulas_off;
            section = SEC_NONE;
            continue;
        }

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        if (prefix_i(line, "Power")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_POWER;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Depth Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_DEPTH;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Restock Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_RESTOCK;
            skip_open = true;
            continue;
        }

        /* lines must end in ; */
        if (line[strlen(line) - 1] != ';') {
            if (section == SEC_DEPTH)
                borg_formula_error(
                    buf, buf, "depth", "** line must end in a ;");
            else if (section == SEC_POWER)
                borg_formula_error(
                    buf, buf, "power", "** line must end in a ;");
            else if (section == SEC_RESTOCK)
                borg_formula_error(
                    buf, buf, "restock", "** line must end in a ;");
            else
                borg_formula_error(buf, buf, "base", "** line must end in a ;");
            formulas_off = true;
        } else {
            if (section == SEC_DEPTH)
                formulas_off = parse_depth_line(false, line, buf);
            if (section == SEC_RESTOCK)
                formulas_off = parse_depth_line(true, line, buf);
            if (section == SEC_POWER)
                formulas_off = parse_power_line(line, buf);
            if (section == SEC_NONE) {
                borg_formula_error(buf, buf, "base",
                    "** line must be part of a Power or Depth section");
                formulas_off = true;
            }
        }
    }
    if (formulas_off && borg_cfg[BORG_USES_DYNAMIC_CALCS])
        borg_cfg[BORG_USES_DYNAMIC_CALCS] = false;

    return formulas_off;
}